

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O2

int __thiscall smf::Binasc::outputStyleBinary(Binasc *this,ostream *out,istream *input)

{
  uint uVar1;
  ostream *poVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  
  uVar1 = std::istream::get();
  lVar3 = *(long *)(*(long *)input + -0x18);
  if (((byte)input[lVar3 + 0x20] & 2) == 0) {
    iVar5 = 0;
    while (((byte)input[lVar3 + 0x20] & 2) == 0) {
      if ((uVar1 & 0xff) < 0x10) {
        std::operator<<(out,'0');
      }
      *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar2 = (ostream *)std::ostream::operator<<(out,uVar1 & 0xff);
      std::operator<<(poVar2,' ');
      iVar5 = iVar5 + 1;
      if (this->m_maxLineBytes <= iVar5) {
        std::operator<<(out,'\n');
        iVar5 = 0;
      }
      uVar1 = std::istream::get();
      lVar3 = *(long *)(*(long *)input + -0x18);
    }
    iVar4 = 1;
    if (iVar5 == 0) {
      return 1;
    }
  }
  else {
    out = std::operator<<((ostream *)&std::cerr,"End of the file right away!");
    iVar4 = 0;
  }
  std::endl<char,std::char_traits<char>>(out);
  return iVar4;
}

Assistant:

int Binasc::outputStyleBinary(std::ostream& out, std::istream& input) {
	int currentByte = 0;    // current byte output in line
	uchar ch;               // current input byte

	ch = input.get();
	if (input.eof()) {
		std::cerr << "End of the file right away!" << std::endl;
		return 0;
	}

	while (!input.eof()) {
		if (ch < 0x10) {
			out << '0';
		}
		out << std::hex << (int)ch << ' ';
		currentByte++;
		if (currentByte >= m_maxLineBytes) {
			out << '\n';
			currentByte = 0;
		}
		ch = input.get();
	}

	if (currentByte != 0) {
		out << std::endl;
	}

	return 1;
}